

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O3

uint32_t trico_get_number_of_colors(void *a)

{
  if (((*(int *)((long)a + 0x24) - 0xdU < 2) && (*(int *)((long)a + 0x40) == 0)) &&
     ((ulong)((long)*(uint32_t **)((long)a + 0x18) + (4 - *(long *)((long)a + 0x10))) <=
      *(ulong *)((long)a + 0x30))) {
    return **(uint32_t **)((long)a + 0x18);
  }
  return 0;
}

Assistant:

uint32_t trico_get_number_of_colors(void* a)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (arch->next_stream_type == trico_vertex_color_stream || arch->next_stream_type == trico_triangle_color_stream)
    {
    uint32_t nr_colors;
    if (!read_inplace(&nr_colors, sizeof(uint32_t), 1, arch))
      return 0;
    return nr_colors;
    }
  return 0;
  }